

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall
presolve::HPresolve::changeImplColUpper
          (HPresolve *this,HighsInt col,double newUpper,HighsInt originRow)

{
  int oldImplVarUpperSource;
  pointer pdVar1;
  bool bVar2;
  long lVar3;
  double *pdVar4;
  HighsInt row;
  long lVar5;
  double *pdVar6;
  double dVar7;
  HighsInt local_60;
  undefined4 local_5c;
  pointer local_58;
  double local_50;
  HighsInt local_44;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_40;
  HighsLinearSumBounds *local_38;
  
  lVar5 = (long)col;
  local_50 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5];
  oldImplVarUpperSource =
       (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar5];
  dVar7 = (this->model->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5] - this->primal_feastol;
  local_60 = col;
  local_58 = (pointer)newUpper;
  if ((dVar7 <= local_50) && (newUpper < dVar7)) {
    markChangedCol(this,col);
  }
  bVar2 = isLowerImplied(this,col);
  if (bVar2) {
    pdVar1 = (this->model->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar7 = pdVar1[lVar5] + this->primal_feastol;
    if (local_50 <= dVar7) {
      local_5c = 0;
    }
    else {
      local_5c = (undefined4)CONCAT71((int7)((ulong)pdVar1 >> 8),(double)local_58 <= dVar7);
    }
  }
  else {
    local_5c = 0;
  }
  if (oldImplVarUpperSource != originRow) {
    if ((oldImplVarUpperSource != -1) &&
       (oldImplVarUpperSource !=
        (this->colLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar5])) {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
                (&(this->colImplSourceByRow).
                  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[oldImplVarUpperSource]._M_t,&local_60);
    }
    if (originRow != -1) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_emplace_unique<int&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 ((this->colImplSourceByRow).
                  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + originRow),&local_60);
    }
    (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[local_60] = originRow;
    lVar5 = (long)local_60;
  }
  (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[lVar5] = (double)local_58;
  if ((char)local_5c == '\0') {
    if (local_50 <= (double)local_58) {
      local_58 = (pointer)local_50;
    }
    if ((this->model->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar5] <= (double)local_58) {
      return;
    }
  }
  local_58 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  lVar5 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5];
  pdVar4 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + lVar5;
  pdVar6 = (double *)
           ((this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + lVar5);
  if (lVar5 == -1) {
    pdVar4 = (double *)0x0;
    pdVar6 = (double *)0x0;
  }
  local_38 = &this->impliedRowBounds;
  local_40 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
             &this->substitutionOpportunities;
  while ((int)lVar5 != -1) {
    HighsLinearSumBounds::updatedImplVarUpper
              (local_38,*(HighsInt *)pdVar6,local_60,*pdVar4,local_50,oldImplVarUpperSource);
    row = *(HighsInt *)pdVar6;
    if (((char)local_5c != '\0') && (bVar2 = isDualImpliedFree(this,row), bVar2)) {
      local_44 = row;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
                (local_40,&local_44,&local_60);
      row = *(HighsInt *)pdVar6;
    }
    markChangedRow(this,row);
    lVar3 = (long)(int)lVar5;
    lVar5 = (long)local_58[lVar3];
    pdVar6 = (double *)((long)pdVar6 + lVar5 * 4 + lVar3 * -4);
    pdVar4 = pdVar4 + (lVar5 - lVar3);
  }
  return;
}

Assistant:

void HPresolve::changeImplColUpper(HighsInt col, double newUpper,
                                   HighsInt originRow) {
  double oldImplUpper = implColUpper[col];
  HighsInt oldUpperSource = colUpperSource[col];
  if (oldImplUpper >= model->col_upper_[col] - primal_feastol &&
      newUpper < model->col_upper_[col] - primal_feastol) {
    // the dual constraint can be considered a >= constraint and was free, or a
    // <= constraint before
    markChangedCol(col);
  }
  bool newImpliedFree =
      isLowerImplied(col) &&
      oldImplUpper > model->col_upper_[col] + primal_feastol &&
      newUpper <= model->col_upper_[col] + primal_feastol;

  // remember the source of this upper bound, so that we can correctly identify
  // weak domination
  if (oldUpperSource != originRow) {
    if (oldUpperSource != -1 && oldUpperSource != colLowerSource[col])
      colImplSourceByRow[oldUpperSource].erase(col);
    if (originRow != -1) colImplSourceByRow[originRow].emplace(col);

    colUpperSource[col] = originRow;
  }

  // update implied bound
  implColUpper[col] = newUpper;

  // if the old and the new implied bound are not better than the upper bound,
  // nothing needs to be updated
  if (!newImpliedFree &&
      std::min(oldImplUpper, newUpper) >= model->col_upper_[col])
    return;

  for (const HighsSliceNonzero& nonzero : getColumnVector(col)) {
    impliedRowBounds.updatedImplVarUpper(nonzero.index(), col, nonzero.value(),
                                         oldImplUpper, oldUpperSource);
    if (newImpliedFree && isDualImpliedFree(nonzero.index()))
      substitutionOpportunities.emplace_back(nonzero.index(), col);

    markChangedRow(nonzero.index());
  }
}